

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O1

ValueType * __thiscall
HighsHashTable<MatrixColumn,_int>::operator[](HighsHashTable<MatrixColumn,_int> *this,KeyType *key)

{
  byte bVar1;
  uchar uVar2;
  _Head_base<0UL,_HighsHashTableEntry<MatrixColumn,_int>_*,_false> _Var3;
  uchar *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  int *piVar10;
  ulong uVar11;
  u8 meta;
  u64 pos;
  u64 maxPos;
  Entry entry;
  u64 startPos;
  uchar local_69;
  ulong local_68;
  ulong local_60;
  HighsHashTableEntry<MatrixColumn,_int> local_58;
  ulong local_40;
  undefined1 local_38 [32];
  
  _Var3._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<MatrixColumn,_int>,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<MatrixColumn,_int>_*,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<MatrixColumn,_int>_*,_false>._M_head_impl;
  bVar9 = findPosition(this,key,&local_69,&local_40,&local_60,&local_68);
  if (bVar9) {
    piVar10 = (int *)((long)(_Var3._M_head_impl + local_68) + 0x14);
  }
  else {
    if ((this->numElements == this->tableSizeMask * 7 + 7 >> 3) || (local_68 == local_60)) {
      growTable(this);
    }
    else {
      uVar8 = _Var3._M_head_impl + local_68;
      local_58.key_.cost = key->cost;
      local_58.key_.lb = key->lb;
      local_58.key_.ub = key->ub;
      local_58.key_.integral = key->integral;
      local_58.value_ = 0;
      local_58.key_.len = key->len;
      this->numElements = this->numElements + 1;
      do {
        puVar4 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        bVar1 = puVar4[local_68];
        if (-1 < (char)bVar1) {
          puVar4[local_68] = local_69;
          *(undefined8 *)((long)(_Var3._M_head_impl + local_68) + 0x10) = local_58._16_8_;
          *(undefined8 *)&_Var3._M_head_impl[local_68].key_ = local_58.key_._0_8_;
          *(undefined8 *)((long)&_Var3._M_head_impl[local_68].key_ + 8) = local_58.key_._8_8_;
          return (int *)(uVar8 + 0x14);
        }
        uVar11 = (ulong)((int)local_68 - (uint)bVar1 & 0x7f);
        if (uVar11 < (local_68 - local_40 & this->tableSizeMask)) {
          local_38._16_4_ = local_58.key_.len;
          local_38._20_4_ = local_58.value_;
          local_38._0_4_ = local_58.key_.cost;
          local_38._4_4_ = local_58.key_.lb;
          local_38._8_4_ = local_58.key_.ub;
          local_38._12_4_ = local_58.key_.integral;
          uVar5 = *(ulong *)((long)(_Var3._M_head_impl + local_68) + 0x10);
          uVar6 = *(undefined8 *)&_Var3._M_head_impl[local_68].key_;
          uVar7 = *(undefined8 *)((long)&_Var3._M_head_impl[local_68].key_ + 8);
          *(undefined8 *)&_Var3._M_head_impl[local_68].key_ = local_58.key_._0_8_;
          *(undefined8 *)((long)&_Var3._M_head_impl[local_68].key_ + 8) = local_58.key_._8_8_;
          *(undefined8 *)((long)(_Var3._M_head_impl + local_68) + 0x10) = local_58._16_8_;
          puVar4 = (this->metadata)._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          uVar2 = puVar4[local_68];
          puVar4[local_68] = local_69;
          local_40 = local_68 - uVar11 & this->tableSizeMask;
          local_60 = local_40 + 0x7f & this->tableSizeMask;
          local_69 = uVar2;
          local_58.key_._0_8_ = uVar6;
          local_58.key_._8_8_ = uVar7;
          local_58._16_8_ = uVar5;
        }
        local_68 = local_68 + 1 & this->tableSizeMask;
      } while (local_68 != local_60);
      growTable(this);
      HighsHashTable<MatrixColumn,int>::insert<HighsHashTableEntry<MatrixColumn,int>>
                ((HighsHashTable<MatrixColumn,int> *)this,&local_58);
    }
    piVar10 = operator[](this,key);
  }
  return piVar10;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }